

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PowerIteration.cpp
# Opt level: O3

EigenAnswer * PowerIterationMethod(EigenAnswer *__return_storage_ptr__,Matrix *m,int *iter)

{
  pointer pdVar1;
  bool bVar2;
  pointer pdVar3;
  int iVar4;
  double dVar5;
  EigenAnswer bad;
  EigenAnswer real;
  Vector third;
  Vector first;
  Vector second;
  vector<double,_std::allocator<double>_> local_138;
  double local_120;
  double local_110;
  vector<double,_std::allocator<double>_> local_108;
  vector<double,_std::allocator<double>_> local_e8;
  double local_d0;
  int *local_c0;
  EigenAnswer local_b8;
  Vector local_90;
  vector<double,_std::allocator<double>_> local_78;
  Vector local_60;
  Vector local_48;
  
  iVar4 = Matrix::GetRows(m);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_108,(long)iVar4,(allocator_type *)&local_e8);
  *local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
   _M_start = 1.0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *iter = 0;
  local_c0 = iter;
  while( true ) {
    std::vector<double,_std::allocator<double>_>::vector(&local_78,&local_108);
    Matrix::operator*(&local_48,m,&local_78);
    Matrix::operator*(&local_90,m,&local_48);
    RealValues(&local_b8,&local_48,&local_90);
    std::vector<double,_std::allocator<double>_>::vector(&local_138,&local_b8.vector);
    local_120 = local_b8.value;
    dVar5 = Utils::EigValueNorm(m,&local_138,local_b8.value);
    if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      local_110 = dVar5;
      operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
      dVar5 = local_110;
    }
    if (1e-13 <= dVar5) {
      OppositeRealValues(__return_storage_ptr__,&local_78,&local_48,&local_90);
      std::vector<double,_std::allocator<double>_>::vector
                (&local_138,&__return_storage_ptr__->vector);
      local_120 = __return_storage_ptr__->value;
      dVar5 = Utils::EigValueNorm(m,&local_138,local_120);
      if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        local_110 = dVar5;
        operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
        dVar5 = local_110;
      }
      bVar2 = 1e-13 <= dVar5;
      if (1e-13 <= dVar5) {
        std::vector<double,_std::allocator<double>_>::operator=
                  (&local_e8,&__return_storage_ptr__->vector);
        local_d0 = __return_storage_ptr__->value;
        Matrix::operator*(&local_60,m,&local_90);
        Utils::Normalized(&local_138,&local_60);
        pdVar3 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        pdVar1 = local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start =
             local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
        local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage =
             local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        if (pdVar1 != (pointer)0x0) {
          operator_delete(pdVar1,(long)pdVar3 - (long)pdVar1);
          if (local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_138.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_138.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_138.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_start);
        }
        *local_c0 = *local_c0 + 1;
        pdVar1 = (__return_storage_ptr__->vector).
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        if (pdVar1 != (pointer)0x0) {
          operator_delete(pdVar1,(long)(__return_storage_ptr__->vector).
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data._M_end_of_storage - (long)pdVar1);
        }
      }
      if (local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_b8.vector.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_b8.vector.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.vector.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->value = local_b8.value;
      bVar2 = false;
    }
    if (local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_90.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (!bVar2) break;
    iVar4 = *local_c0;
    *local_c0 = iVar4 + 3;
    if (0x752c < iVar4) {
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->vector).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      __return_storage_ptr__->value = local_d0;
LAB_0010714d:
      if (local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_108.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return __return_storage_ptr__;
    }
  }
  if (local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  goto LAB_0010714d;
}

Assistant:

EigenAnswer PowerIterationMethod(const Matrix &m, int &iter)
{
    const int n = m.GetRows();
    Vector initial(n);
    initial[0] = 1;

    EigenAnswer bad;
    for (iter = 0; iter < defaultMaxIterations; iter += 3)
    {
        auto first = initial;
        auto second = m * first;
        auto third = m * second;

        auto real = RealValues(second, third);
        if (TestEigen(m, {real}, PIeps))
        {
            return real;
        }

        auto opposite = OppositeRealValues(first, second, third);
        if (TestEigen(m, {opposite}, PIeps))
        {
            return opposite;
        }
        bad = opposite;
        initial = Utils::Normalized(m * third);
        iter++;
    }

    return bad;
}